

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collator.cpp
# Opt level: O0

void __thiscall
booster::locale::impl_icu::collate_impl<wchar_t>::collate_impl(collate_impl<wchar_t> *this,cdata *d)

{
  Locale *in_RSI;
  undefined8 *in_RDI;
  size_t in_stack_ffffffffffffff78;
  collator<wchar_t> *in_stack_ffffffffffffff80;
  undefined8 *local_60;
  string local_30;
  Locale *local_10;
  
  local_10 = in_RSI;
  collator<wchar_t>::collator(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  *in_RDI = &PTR__collate_impl_002eaa58;
  std::__cxx11::string::string((string *)&local_30,(string *)(local_10 + 0xe0));
  icu_std_converter<wchar_t,_4>::icu_std_converter
            ((icu_std_converter<wchar_t,_4> *)(in_RDI + 3),&local_30,cvt_skip);
  std::__cxx11::string::~string((string *)&local_30);
  icu_70::Locale::Locale((Locale *)(in_RDI + 4),local_10);
  local_60 = in_RDI + 0x20;
  do {
    thread_specific_ptr<icu_70::Collator>::thread_specific_ptr
              ((thread_specific_ptr<icu_70::Collator> *)0x260105);
    local_60 = local_60 + 1;
  } while (local_60 != in_RDI + 0x25);
  *(byte *)(in_RDI + 0x25) = (byte)local_10[0x100] & 1;
  return;
}

Assistant:

collate_impl(cdata const &d) : 
                    cvt_(d.encoding),
                    locale_(d.locale),
                    is_utf8_(d.utf8)
                {
                
                }